

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O1

ostream * std::operator<<(ostream *os,color3h *v)

{
  ostream *poVar1;
  float fVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  fVar2 = tinyusdz::value::half_to_float((half)(v->r).value);
  poVar1 = std::ostream::_M_insert<double>((double)fVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  fVar2 = tinyusdz::value::half_to_float((half)(v->g).value);
  poVar1 = std::ostream::_M_insert<double>((double)fVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  fVar2 = tinyusdz::value::half_to_float((half)(v->b).value);
  poVar1 = std::ostream::_M_insert<double>((double)fVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::color3h &v) {
  os << "(" << tinyusdz::value::half_to_float(v.r) << ", "
     << tinyusdz::value::half_to_float(v.g) << ", "
     << tinyusdz::value::half_to_float(v.b) << ")";
  return os;
}